

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

char * Gia_DeriveFormula(Gia_Man_t *pGia,char **ppNamesIn)

{
  int iLit;
  Vec_Str_t *p;
  Gia_Man_t *p_00;
  Gia_Obj_t *pObj_00;
  char *pcVar1;
  Gia_Obj_t *pObj;
  Gia_Man_t *pMuxes;
  Vec_Str_t *vStr;
  char *pResult;
  char **ppNamesIn_local;
  Gia_Man_t *pGia_local;
  
  p = Vec_StrAlloc(1000);
  p_00 = Gia_ManDupMuxes(pGia,2);
  pObj_00 = Gia_ManCo(pGia,0);
  Vec_StrPush(p,'(');
  iLit = Gia_ObjFaninLit0p(pGia,pObj_00);
  Gia_DeriveFormula_rec(pGia,ppNamesIn,p,iLit);
  Vec_StrPush(p,')');
  Vec_StrPush(p,'\0');
  Gia_ManStop(p_00);
  pcVar1 = Vec_StrReleaseArray(p);
  Vec_StrFree(p);
  return pcVar1;
}

Assistant:

char * Gia_DeriveFormula( Gia_Man_t * pGia, char ** ppNamesIn )
{
    char * pResult;
    Vec_Str_t * vStr   = Vec_StrAlloc( 1000 );
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( pGia, 2 );
    Gia_Obj_t * pObj   = Gia_ManCo( pGia, 0 );
    Vec_StrPush( vStr, '(' );
    Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
    Vec_StrPush( vStr, ')' );
    Vec_StrPush( vStr, '\0' );
    Gia_ManStop( pMuxes );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}